

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::BlobProto::InternalSerializeWithCachedSizesToArray
          (BlobProto *this,bool deterministic,uint8 *target)

{
  BlobShape *this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 2) != 0) {
    uVar8 = (ulong)this->num_;
    pbVar5 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar9;
    target = pbVar5 + 1;
  }
  if ((uVar7 & 4) != 0) {
    uVar8 = (ulong)this->channels_;
    pbVar5 = target + 1;
    *target = 0x10;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar9;
    target = pbVar5 + 1;
  }
  if ((uVar7 & 8) != 0) {
    uVar8 = (ulong)this->height_;
    pbVar5 = target + 1;
    *target = 0x18;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar9;
    target = pbVar5 + 1;
  }
  if ((uVar7 & 0x10) != 0) {
    uVar8 = (ulong)this->width_;
    pbVar5 = target + 1;
    *target = 0x20;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar9;
    target = pbVar5 + 1;
  }
  if (0 < (this->data_).current_size_) {
    *target = 0x2a;
    pbVar5 = target + 1;
    uVar4 = this->_data_cached_byte_size_;
    uVar3 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar5 = (byte)uVar4 | 0x80;
        uVar3 = uVar4 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar3;
    target = google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<float>
                       (&this->data_,
                        google::protobuf::internal::WireFormatLite::WriteFloatNoTagToArray,
                        pbVar5 + 1);
  }
  if (0 < (this->diff_).current_size_) {
    *target = 0x32;
    pbVar5 = target + 1;
    uVar4 = this->_diff_cached_byte_size_;
    uVar3 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar5 = (byte)uVar4 | 0x80;
        uVar3 = uVar4 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar3;
    target = google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<float>
                       (&this->diff_,
                        google::protobuf::internal::WireFormatLite::WriteFloatNoTagToArray,
                        pbVar5 + 1);
  }
  if ((uVar7 & 1) != 0) {
    this_00 = this->shape_;
    *target = 0x3a;
    pbVar5 = target + 1;
    uVar7 = this_00->_cached_size_;
    uVar4 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar4;
    target = BlobShape::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar5 + 1);
  }
  if (0 < (this->double_data_).current_size_) {
    *target = 0x42;
    pbVar5 = target + 1;
    uVar7 = this->_double_data_cached_byte_size_;
    uVar4 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar4;
    target = google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<double>
                       (&this->double_data_,
                        google::protobuf::internal::WireFormatLite::WriteDoubleNoTagToArray,
                        pbVar5 + 1);
  }
  if (0 < (this->double_diff_).current_size_) {
    *target = 0x4a;
    pbVar5 = target + 1;
    uVar7 = this->_double_diff_cached_byte_size_;
    uVar4 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar4;
    target = google::protobuf::internal::WireFormatLite::WriteFixedNoTagToArray<double>
                       (&this->double_diff_,
                        google::protobuf::internal::WireFormatLite::WriteDoubleNoTagToArray,
                        pbVar5 + 1);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar6 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* BlobProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.BlobProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 num = 1 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->num(), target);
  }

  // optional int32 channels = 2 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->channels(), target);
  }

  // optional int32 height = 3 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->height(), target);
  }

  // optional int32 width = 4 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->width(), target);
  }

  // repeated float data = 5 [packed = true];
  if (this->data_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      5,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _data_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteFloatNoTagToArray(this->data_, target);
  }

  // repeated float diff = 6 [packed = true];
  if (this->diff_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      6,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _diff_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteFloatNoTagToArray(this->diff_, target);
  }

  // optional .caffe.BlobShape shape = 7;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->shape_, deterministic, target);
  }

  // repeated double double_data = 8 [packed = true];
  if (this->double_data_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      8,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _double_data_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteDoubleNoTagToArray(this->double_data_, target);
  }

  // repeated double double_diff = 9 [packed = true];
  if (this->double_diff_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      9,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _double_diff_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteDoubleNoTagToArray(this->double_diff_, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.BlobProto)
  return target;
}